

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_CALLNZ(Context *ctx)

{
  size_t in_RCX;
  size_t buflen;
  char src1 [64];
  char scratch [64];
  char labelstr [64];
  
  if (ctx->profile_supports_nv2 != 0) {
    get_ARB1_srcarg_varname(ctx,0,labelstr,in_RCX);
    get_ARB1_srcarg_varname(ctx,1,src1,in_RCX);
    allocate_ARB1_scratch_reg_name(ctx,scratch,buflen);
    output_line(ctx,"MOVC %s, %s;",scratch,src1);
    output_line(ctx,"CAL %s (NE.x);",labelstr);
    return;
  }
  failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  return;
}

Assistant:

static void emit_ARB1_CALLNZ(Context *ctx)
{
    // !!! FIXME: if src1 is a constbool that's true, we can remove the
    // !!! FIXME:  if. If it's false, we can make this a no-op.

    if (!support_nv2(ctx))  // no branching in stock ARB1.
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    else
    {
        // !!! FIXME: double-check this.
        char labelstr[64];
        char scratch[64];
        char src1[64];
        get_ARB1_srcarg_varname(ctx, 0, labelstr, sizeof (labelstr));
        get_ARB1_srcarg_varname(ctx, 1, src1, sizeof (src1));
        allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));
        output_line(ctx, "MOVC %s, %s;", scratch, src1);
        output_line(ctx, "CAL %s (NE.x);", labelstr);
    } // else
}